

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O3

int Abc_NtkMaxFlowFwdPath2_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pObj_00;
  int iVar5;
  long lVar6;
  int in_EDX;
  int Fill;
  long lVar7;
  
  pAVar2 = pObj->pNtk;
  iVar5 = pObj->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,in_EDX);
  if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pObj->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar5] == iVar1) {
    return 0;
  }
  iVar5 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,Fill);
  if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar5] = iVar1;
  if ((pObj->field_6).pTemp == (void *)0x0) {
    if ((pObj->field_0x14 & 0x10) != 0) {
      pObj->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
      return 1;
    }
    if (0 < (pObj->vFanouts).nSize) {
      lVar6 = 0;
      do {
        pAVar4 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
        iVar5 = Abc_NtkMaxFlowFwdPath2_rec(pAVar4);
        if (iVar5 != 0) {
          (pObj->field_6).pCopy = pAVar4;
          return 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (pObj->vFanouts).nSize);
      return 0;
    }
    return 0;
  }
  lVar6 = (long)(pObj->vFanins).nSize;
  if (lVar6 < 1) {
    return 0;
  }
  lVar7 = 0;
  while (pAVar4 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar7]],
        (Abc_Obj_t *)(pAVar4->field_6).pTemp != pObj) {
    lVar7 = lVar7 + 1;
    if (lVar6 == lVar7) {
      return 0;
    }
  }
  if (0 < (pAVar4->vFanouts).nSize) {
    lVar6 = 0;
    do {
      pObj_00 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanouts).pArray[lVar6]];
      iVar5 = Abc_NtkMaxFlowFwdPath2_rec(pObj_00);
      if (iVar5 != 0) {
        (pAVar4->field_6).pCopy = pObj_00;
        return 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pAVar4->vFanouts).nSize);
  }
  iVar5 = Abc_NtkMaxFlowFwdPath2_rec(pAVar4);
  if (iVar5 == 0) {
    return 0;
  }
  (pAVar4->field_6).pTemp = (void *)0x0;
  return 1;
}

Assistant:

int Abc_NtkMaxFlowFwdPath2_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout, * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    // process node without flow
    if ( !Abc_ObjGetPath(pObj) )
    { 
        // start the path if we reached a terminal node
        if ( pObj->fMarkA )
            return Abc_ObjSetPath( pObj, (Abc_Obj_t *)1 );
        // explore the fanins
        Abc_ObjForEachFanout( pObj, pFanout, i )
            if ( Abc_NtkMaxFlowFwdPath2_rec(pFanout) )
                return Abc_ObjSetPath( pObj, pFanout );
        return 0;
    }
    // pObj has flow - find the fanout with flow
    pFanin = Abc_ObjGetFaninPath( pObj );
    if ( pFanin == NULL )
        return 0;
    // go through the fanins of the fanout with flow
    Abc_ObjForEachFanout( pFanin, pFanout, i )
        if ( Abc_NtkMaxFlowFwdPath2_rec( pFanout ) )
            return Abc_ObjSetPath( pFanin, pFanout );
    // try the fanout
    if ( Abc_NtkMaxFlowFwdPath2_rec( pFanin ) )
        return Abc_ObjSetPath( pFanin, NULL );
    return 0;
}